

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

float mpack_expect_float_strict(mpack_reader_t *reader)

{
  float fVar1;
  mpack_tag_t mVar2;
  
  mVar2 = mpack_read_tag(reader);
  if (mVar2.type == mpack_type_float) {
    fVar1 = mVar2.v._0_4_;
  }
  else {
    mpack_reader_flag_error(reader,mpack_error_type);
    fVar1 = 0.0;
  }
  return fVar1;
}

Assistant:

float mpack_expect_float_strict(mpack_reader_t* reader) {
    mpack_tag_t var = mpack_read_tag(reader);
    if (var.type == mpack_type_float)
        return var.v.f;
    mpack_reader_flag_error(reader, mpack_error_type);
    return 0.0f;
}